

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O3

void __thiscall
proto2_unittest::TestParsingMergeLite_OptionalGroup::~TestParsingMergeLite_OptionalGroup
          (TestParsingMergeLite_OptionalGroup *this)

{
  InternalMetadata *this_00;
  TestAllTypesLite *self;
  ulong uVar1;
  LogMessageFatal local_20;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    google::protobuf::internal::InternalMetadata::DeleteOutOfLineHelper<std::__cxx11::string>
              (this_00);
    uVar1 = this_00->ptr_;
  }
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    self = (this->field_0)._impl_.optional_group_all_types_;
    if (self != (TestAllTypesLite *)0x0) {
      TestAllTypesLite::SharedDtor(&self->super_MessageLite);
    }
    operator_delete(self,0x348);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/unittest_lite.pb.cc"
             ,0x1f5b,"this_.GetArena() == nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

TestParsingMergeLite_OptionalGroup::~TestParsingMergeLite_OptionalGroup() {
  // @@protoc_insertion_point(destructor:proto2_unittest.TestParsingMergeLite.OptionalGroup)
  SharedDtor(*this);
}